

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

void Cbs2_ManWatchClause(Cbs2_Man_t *p,int hClause,int Lit)

{
  int iVar1;
  int *piVar2;
  int *piVar3;
  int *pPlace;
  int *pLits;
  int Lit_local;
  int hClause_local;
  Cbs2_Man_t *p_local;
  
  piVar2 = Cbs2_ClauseLits(p,hClause);
  iVar1 = Abc_LitNot(Lit);
  piVar3 = Vec_IntEntryP(&p->vWatches,iVar1);
  if (*piVar3 == 0) {
    iVar1 = Abc_LitNot(Lit);
    Vec_IntPush(&p->vWatchUpds,iVar1);
  }
  if ((Lit != *piVar2) && (Lit != piVar2[1])) {
    __assert_fail("Lit == pLits[0] || Lit == pLits[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCSat2.c"
                  ,0x2a3,"void Cbs2_ManWatchClause(Cbs2_Man_t *, int, int)");
  }
  Cbs2_ClauseSetNext(p,hClause,(uint)(Lit == piVar2[1]),*piVar3);
  *piVar3 = hClause;
  return;
}

Assistant:

static inline void Cbs2_ManWatchClause( Cbs2_Man_t * p, int hClause, int Lit )
{
    int * pLits = Cbs2_ClauseLits( p, hClause );
    int * pPlace = Vec_IntEntryP( &p->vWatches, Abc_LitNot(Lit) );
    if ( *pPlace == 0 )
        Vec_IntPush( &p->vWatchUpds, Abc_LitNot(Lit) );
/*
    if ( pClause->pLits[0] == Lit )
        pClause->pNext0 = p->pWatches[lit_neg(Lit)];  
    else
    {
        assert( pClause->pLits[1] == Lit );
        pClause->pNext1 = p->pWatches[lit_neg(Lit)];  
    }
    p->pWatches[lit_neg(Lit)] = pClause;
*/
    assert( Lit == pLits[0] || Lit == pLits[1] );
    Cbs2_ClauseSetNext( p, hClause, Lit == pLits[1], *pPlace );
    *pPlace = hClause;
}